

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O0

LanguageBreakEngine * __thiscall
icu_63::ICULanguageBreakFactory::getEngineFor(ICULanguageBreakFactory *this,UChar32 c)

{
  UBool UVar1;
  int iVar2;
  UStack *this_00;
  undefined4 extraout_var;
  undefined1 *size;
  UStack *local_78;
  int local_64;
  int32_t i;
  UStack *engines;
  Mutex m;
  UErrorCode status;
  LanguageBreakEngine *lbe;
  UChar32 c_local;
  ICULanguageBreakFactory *this_local;
  
  m.fMutex._4_4_ = U_ZERO_ERROR;
  size = gBreakEngineMutex;
  Mutex::Mutex((Mutex *)&engines,(UMutex *)gBreakEngineMutex);
  if (this->fEngines == (UStack *)0x0) {
    this_00 = (UStack *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    local_78 = (UStack *)0x0;
    if (this_00 != (UStack *)0x0) {
      UStack::UStack(this_00,_deleteEngine,(UElementsAreEqual *)0x0,
                     (UErrorCode *)((long)&m.fMutex + 4));
      local_78 = this_00;
    }
    UVar1 = ::U_FAILURE(m.fMutex._4_4_);
    if ((UVar1 == '\0') && (local_78 != (UStack *)0x0)) {
      this->fEngines = local_78;
LAB_0040028c:
      iVar2 = (*(this->super_LanguageBreakFactory)._vptr_LanguageBreakFactory[3])
                        (this,(ulong)(uint)c);
      this_local = (ICULanguageBreakFactory *)CONCAT44(extraout_var,iVar2);
      if (this_local != (ICULanguageBreakFactory *)0x0) {
        UStack::push(this->fEngines,this_local,(UErrorCode *)((long)&m.fMutex + 4));
      }
    }
    else {
      if (local_78 != (UStack *)0x0) {
        (*(local_78->super_UVector).super_UObject._vptr_UObject[1])();
      }
      this_local = (ICULanguageBreakFactory *)0x0;
    }
  }
  else {
    local_64 = UVector::size(&this->fEngines->super_UVector);
    do {
      local_64 = local_64 + -1;
      if (local_64 < 0) goto LAB_0040028c;
      this_local = (ICULanguageBreakFactory *)
                   UVector::elementAt(&this->fEngines->super_UVector,local_64);
    } while ((this_local == (ICULanguageBreakFactory *)0x0) ||
            (iVar2 = (*(this_local->super_LanguageBreakFactory)._vptr_LanguageBreakFactory[2])
                               (this_local,(ulong)(uint)c), (char)iVar2 == '\0'));
  }
  Mutex::~Mutex((Mutex *)&engines);
  return (LanguageBreakEngine *)this_local;
}

Assistant:

const LanguageBreakEngine *
ICULanguageBreakFactory::getEngineFor(UChar32 c) {
    const LanguageBreakEngine *lbe = NULL;
    UErrorCode  status = U_ZERO_ERROR;

    Mutex m(&gBreakEngineMutex);

    if (fEngines == NULL) {
        UStack  *engines = new UStack(_deleteEngine, NULL, status);
        if (U_FAILURE(status) || engines == NULL) {
            // Note: no way to return error code to caller.
            delete engines;
            return NULL;
        }
        fEngines = engines;
    } else {
        int32_t i = fEngines->size();
        while (--i >= 0) {
            lbe = (const LanguageBreakEngine *)(fEngines->elementAt(i));
            if (lbe != NULL && lbe->handles(c)) {
                return lbe;
            }
        }
    }
    
    // We didn't find an engine. Create one.
    lbe = loadEngineFor(c);
    if (lbe != NULL) {
        fEngines->push((void *)lbe, status);
    }
    return lbe;
}